

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t utf8_line_length(utf8_char_t *data)

{
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = *data;
  if (bVar2 == 0) {
    return 0;
  }
  sVar1 = 1;
  do {
    uVar3 = (ulong)bVar2;
    if (bVar2 != 0) {
      if (bVar2 == 10) {
        bVar2 = 0xd;
LAB_00104998:
        return sVar1 + (((byte *)data)[1] == bVar2);
      }
      if (bVar2 == 0xd) {
        bVar2 = 10;
        goto LAB_00104998;
      }
      uVar3 = *(ulong *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar2 & 0xf8));
    }
    data = (utf8_char_t *)((byte *)data + uVar3);
    if (((byte *)data)[sVar1] == 0) {
      return sVar1;
    }
    bVar2 = *data;
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

size_t utf8_line_length(const utf8_char_t* data)
{
    size_t n, len = 0;

    for (len = 0; 0 != data[len]; ++len) {
        if (0 < (n = _utf8_newline(data))) {
            return len + n;
        }

        data += utf8_char_length(data);
    }

    return len;
}